

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

Token * __thiscall EOPlus::Lexer::ReadString(Token *__return_storage_ptr__,Lexer *this)

{
  variant *pvVar1;
  bool bVar2;
  bool bVar3;
  Lexer_Error *this_00;
  char c;
  allocator<char> local_119;
  string s;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  string local_d0;
  variant local_b0;
  variant local_70;
  
  c = '\0';
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/lex.cpp:124:27)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/lex.cpp:124:27)>
             ::_M_manager;
  bVar2 = GetCharIf(this,&c,(function<bool_(char)> *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (bVar2) {
    pvVar1 = &local_b0;
    bVar2 = false;
LAB_0012e6a0:
    bVar3 = GetChar(this,&c);
    if (bVar3) {
      if (!bVar2) goto code_r0x0012e6ba;
      goto LAB_0012e6cc;
    }
LAB_0012e704:
    util::variant::variant(&local_b0,&s);
    Token::Token(__return_storage_ptr__,String,&local_b0);
  }
  else {
    util::variant::variant(&local_70);
    Token::Token(__return_storage_ptr__,Invalid,&local_70);
    pvVar1 = &local_70;
  }
  std::__cxx11::string::~string((string *)&pvVar1->val_string);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
code_r0x0012e6ba:
  bVar2 = true;
  if (c != '\\') {
    if (c == '\"') goto LAB_0012e704;
    if (c == '\n') {
      this_00 = (Lexer_Error *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Unterminated string on previous line",&local_119);
      Lexer_Error::Lexer_Error(this_00,&local_d0,this->row,this->col);
      __cxa_throw(this_00,&Lexer_Error::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_0012e6cc:
    bVar2 = false;
    std::__cxx11::string::push_back((char)&s);
  }
  goto LAB_0012e6a0;
}

Assistant:

Token Lexer::ReadString()
	{
		char c = '\0';
		std::string s;
		bool escape = false;

		if (!this->GetCharIf(c, [](char c) { return c == '"'; }))
			return Token();

		while (this->GetChar(c))
		{
			if (escape)
			{
				switch (c)
				{
					// No real need for any explicit escape codes...
					default: s += c; break;
				};

				escape = false;
			}
			else if (c == '\\')
			{
				escape = true;
			}
			else if (c == '"')
			{
				break;
			}
			else if (c == '\n')
			{
				throw Lexer_Error("Unterminated string on previous line", this->row, this->col);
			}
			else
			{
				s += c;
			}
		}

		return Token(Token::String, s);
	}